

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

bool has_this(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v,VarId *s)

{
  uint32_t uVar1;
  pointer pVVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  uint32_t *puVar7;
  ulong uVar8;
  
  pVVar2 = (v->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(v->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)pVVar2;
  if (lVar5 == 0) {
    return false;
  }
  uVar6 = lVar5 >> 4;
  bVar4 = true;
  if (pVVar2->id != s->id) {
    puVar7 = &pVVar2[1].id;
    uVar3 = 1;
    do {
      uVar8 = uVar3;
      if (uVar6 + (uVar6 == 0) == uVar8) break;
      uVar1 = *puVar7;
      puVar7 = puVar7 + 4;
      uVar3 = uVar8 + 1;
    } while (uVar1 != s->id);
    bVar4 = uVar8 < uVar6;
  }
  return bVar4;
}

Assistant:

bool has_this(vector<mir::inst::VarId> v, mir::inst::VarId s) {
  for (int i = 0; i < v.size(); i++) {
    if (v[i] == s) {
      return true;
    }
  }
  return false;
}